

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::SetWorldSize(World *this,int width,int height)

{
  reference this_00;
  int local_1c;
  int i;
  int height_local;
  int width_local;
  World *this_local;
  
  this->worldHeight = height;
  this->worldWidth = width;
  std::
  vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
  ::resize(&this->world,(long)height);
  for (local_1c = 0; local_1c < height; local_1c = local_1c + 1) {
    this_00 = std::
              vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
              ::at(&this->world,(long)local_1c);
    std::vector<Tiles,_std::allocator<Tiles>_>::resize(this_00,(long)width);
  }
  return;
}

Assistant:

void World::SetWorldSize(int width, int height)
{
	worldHeight = height;
	worldWidth = width;

	world.resize(height);
	for (int i = 0; i < height; ++i)
	{
		world.at(i).resize(width);
	}
}